

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O2

ErrorList * errorlist_create(MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  ErrorList *pEVar1;
  
  pEVar1 = (ErrorList *)(*m)(0x48,d);
  if (pEVar1 != (ErrorList *)0x0) {
    pEVar1->tail = (ErrorItem *)0x0;
    *(undefined8 *)&pEVar1->count = 0;
    *(undefined8 *)&(pEVar1->head).error.error_position = 0;
    (pEVar1->head).next = (ErrorItem *)0x0;
    (pEVar1->head).error.error = (char *)0x0;
    (pEVar1->head).error.filename = (char *)0x0;
    pEVar1->tail = (ErrorItem *)pEVar1;
    pEVar1->m = m;
    pEVar1->f = f;
    pEVar1->d = d;
  }
  return pEVar1;
}

Assistant:

ErrorList *errorlist_create(MOJOSHADER_malloc m, MOJOSHADER_free f, void *d)
{
    ErrorList *retval = (ErrorList *) m(sizeof (ErrorList), d);
    if (retval != NULL)
    {
        memset(retval, '\0', sizeof (ErrorList));
        retval->tail = &retval->head;
        retval->m = m;
        retval->f = f;
        retval->d = d;
    } // if

    return retval;
}